

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

directory_iterator * __thiscall
ghc::filesystem::directory_iterator::operator++(directory_iterator *this)

{
  filesystem_error *this_00;
  error_code ec_00;
  error_code ec;
  error_code local_48;
  string local_38;
  
  local_48._M_value = 0;
  local_48._M_cat = (error_category *)std::_V2::system_category();
  impl::increment((this->_impl).
                  super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,&local_48);
  if (local_48._M_value == 0) {
    return this;
  }
  this_00 = (filesystem_error *)__cxa_allocate_exception(0x90);
  detail::systemErrorText<int>(&local_38,local_48._M_value);
  ec_00._4_4_ = 0;
  ec_00._M_value = local_48._M_value;
  ec_00._M_cat = local_48._M_cat;
  filesystem_error::filesystem_error
            (this_00,&local_38,
             &(((this->_impl).
                super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_dir_entry)._path,ec_00);
  __cxa_throw(this_00,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE directory_iterator& directory_iterator::operator++()
{
    std::error_code ec;
    _impl->increment(ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), _impl->_dir_entry._path, ec);
    }
    return *this;
}